

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::
BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
::ExpressionIterator::ExpressionIterator
          (ExpressionIterator *this,
          BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
          *expression)

{
  View<int,_false,_std::allocator<unsigned_long>_> *pVVar1;
  reference piVar2;
  int local_20 [2];
  
  pVVar1 = expression->e1_;
  (this->iterator1_).expression_ = pVVar1;
  local_20[0] = 0;
  piVar2 = marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>(pVVar1,local_20);
  (this->iterator1_).data_ = piVar2;
  (this->iterator1_).offset_ = 0;
  pVVar1 = expression->e2_;
  (this->iterator2_).expression_ = pVVar1;
  local_20[1] = 0;
  piVar2 = marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>(pVVar1,local_20 + 1);
  (this->iterator2_).data_ = piVar2;
  (this->iterator2_).offset_ = 0;
  return;
}

Assistant:

ExpressionIterator(const BinaryViewExpression<E1, T1, E2, T2, BinaryFunctor>& expression)
        : binaryFunctor_(expression.binaryFunctor_),
          iterator1_(expression.e1_), 
          iterator2_(expression.e2_)
            {}